

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZPersistenceManager.cpp
# Opt level: O0

TPZSavable * TPZPersistenceManager::GetInstance(int64_t *objId)

{
  bool bVar1;
  TPZRestoredInstance *pTVar2;
  TPZSavable *pTVar3;
  TPZAutoPointer<TPZChunkInTranslation> *pTVar4;
  TPZChunkInTranslation *pTVar5;
  size_t sVar6;
  long *in_RDI;
  size_t in_stack_00000408;
  char *in_stack_00000410;
  TPZSavable *local_8;
  
  if (*in_RDI == -1) {
    local_8 = (TPZSavable *)0x0;
  }
  else {
    pTVar2 = TPZVec<TPZRestoredInstance>::operator[](&mObjVec,*in_RDI);
    bVar1 = TPZRestoredInstance::IsAlreadyRead(pTVar2);
    if (!bVar1) {
      pTVar2 = TPZVec<TPZRestoredInstance>::operator[](&mObjVec,*in_RDI);
      TPZRestoredInstance::SetRead(pTVar2);
      pTVar2 = TPZVec<TPZRestoredInstance>::operator[](&mObjVec,*in_RDI);
      pTVar3 = TPZRestoredInstance::GetPointerToMyObj(pTVar2);
      pTVar4 = TPZVec<TPZAutoPointer<TPZChunkInTranslation>_>::operator[](&mChunksVec,*in_RDI);
      pTVar5 = TPZAutoPointer<TPZChunkInTranslation>::operator->(pTVar4);
      (*pTVar3->_vptr_TPZSavable[6])(pTVar3,&pTVar5->mNewStream,0);
      pTVar4 = TPZVec<TPZAutoPointer<TPZChunkInTranslation>_>::operator[](&mChunksVec,*in_RDI);
      pTVar5 = TPZAutoPointer<TPZChunkInTranslation>::operator->(pTVar4);
      sVar6 = TPZContBufferedStream::Size(&pTVar5->mNewStream);
      if (sVar6 != 0) {
        pzinternal::DebugStopImpl(in_stack_00000410,in_stack_00000408);
      }
    }
    pTVar2 = TPZVec<TPZRestoredInstance>::operator[](&mObjVec,*in_RDI);
    local_8 = TPZRestoredInstance::GetPointerToMyObj(pTVar2);
  }
  return local_8;
}

Assistant:

TPZSavable *TPZPersistenceManager::GetInstance(const int64_t &objId) {
    if (objId != -1) {
        if (!mObjVec[objId].IsAlreadyRead()) {
            mObjVec[objId].SetRead();
            mObjVec[objId].GetPointerToMyObj()->Read(mChunksVec[objId]->mNewStream, NULL);
            if (mChunksVec[objId]->mNewStream.Size() != 0) {
                DebugStop();
            }
        }
        return mObjVec[objId].GetPointerToMyObj();
    }
    return NULL;
}